

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

void pbrt::ParallelFor(int64_t start,int64_t end,function<void_(long,_long)> *func)

{
  _Manager_type p_Var1;
  ThreadPool *job;
  byte bVar2;
  long lVar3;
  long lVar4;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_98 [2];
  undefined **local_78 [2];
  undefined5 uStack_68;
  undefined3 uStack_63;
  int iStack_60;
  undefined1 uStack_5c;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  pointer local_38;
  pointer local_30;
  undefined4 local_28;
  
  job = threadPool;
  if (threadPool == (ThreadPool *)0x0) {
    LogFatal<char_const(&)[11]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.cpp"
               ,0x131,"Check failed: %s",(char (*) [11])0x4aeab2);
  }
  lVar3 = (end - start) /
          ((long)(((ulong)(*(int *)&(threadPool->threads).
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(threadPool->threads).
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xfffffff8) << 0x20)
                 + 0x800000000) >> 0x20);
  lVar4 = 1;
  if (1 < lVar3) {
    lVar4 = lVar3;
  }
  if (end - start < lVar4) {
    local_98[0]._M_device = (mutex_type *)end;
    local_78[0] = (undefined **)start;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*func->_M_invoker)((_Any_data *)func,(long *)local_78,(long *)local_98);
  }
  else {
    local_98[1]._M_device = (mutex_type *)0x0;
    local_98[1]._8_8_ = 0;
    p_Var1 = (func->super__Function_base)._M_manager;
    local_40 = func->_M_invoker;
    if (p_Var1 != (_Manager_type)0x0) {
      local_98[1]._M_device = *(mutex_type **)&(func->super__Function_base)._M_functor;
      local_98[1]._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
      (func->super__Function_base)._M_manager = (_Manager_type)0x0;
      func->_M_invoker = (_Invoker_type)0x0;
    }
    local_78[1] = (undefined **)0x0;
    uStack_68._0_1_ = (condition_variable)0x0;
    uStack_68._1_4_ = 0;
    uStack_63 = 0;
    iStack_60 = 0;
    uStack_5c = 0;
    local_78[0] = &PTR__ParallelForLoop1D_0303b068;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (_Manager_type)0x0;
    if (p_Var1 != (_Manager_type)0x0) {
      local_58._M_unused._M_object = local_98[1]._M_device;
      local_58._8_8_ = local_98[1]._8_8_;
      local_48 = p_Var1;
    }
    local_28 = (undefined4)lVar4;
    local_38 = (pointer)start;
    local_30 = (pointer)end;
    ThreadPool::AddToJobList((ThreadPool *)local_98,(ParallelJob *)job);
    while( true ) {
      bVar2 = (*(code *)((__pthread_internal_list *)((long)local_78[0] + 0x10))->__next)(local_78);
      if ((bVar2 | iStack_60 != 0) != 1) break;
      ThreadPool::WorkOrWait(threadPool,local_98);
    }
    std::unique_lock<std::mutex>::~unique_lock(local_98);
    local_78[0] = &PTR__ParallelForLoop1D_0303b068;
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  return;
}

Assistant:

void ParallelFor(int64_t start, int64_t end, std::function<void(int64_t, int64_t)> func) {
    CHECK(threadPool);
    int64_t chunkSize = std::max<int64_t>(1, (end - start) / (8 * RunningThreads()));
    if (end - start < chunkSize) {
        func(start, end);
        return;
    }

    // Create and enqueue _ParallelJob_ for this loop
    ParallelForLoop1D loop(start, end, chunkSize, std::move(func));
    std::unique_lock<std::mutex> lock = threadPool->AddToJobList(&loop);

    // Help out with parallel loop iterations in the current thread
    while (!loop.Finished())
        threadPool->WorkOrWait(&lock);
}